

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O0

void __thiscall
CCheckQueue<CScriptCheck>::Add
          (CCheckQueue<CScriptCheck> *this,
          vector<CScriptCheck,_std::allocator<CScriptCheck>_> *vChecks)

{
  long lVar1;
  bool bVar2;
  move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck_*,_std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>_>_>
  __last;
  move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck_*,_std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>_>_>
  this_00;
  size_type sVar3;
  const_iterator in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  Mutex *in_stack_ffffffffffffff58;
  __normal_iterator<CScriptCheck_*,_std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>_>
  in_stack_ffffffffffffff60;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffff98;
  move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck_*,_std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>_>_>
  __first;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::empty(in_stack_ffffffffffffff68)
  ;
  if (!bVar2) {
    MaybeCheckNotHeld(in_stack_ffffffffffffff58);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RDI,in_stack_ffffffffffffff80,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff78 >> 0x18,0));
    std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::end
              ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)
               in_stack_ffffffffffffff60._M_current);
    __gnu_cxx::
    __normal_iterator<CScriptCheck_const*,std::vector<CScriptCheck,std::allocator<CScriptCheck>>>::
    __normal_iterator<CScriptCheck*>
              ((__normal_iterator<const_CScriptCheck_*,_std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>_>
                *)in_stack_ffffffffffffff68,
               (__normal_iterator<CScriptCheck_*,_std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>_>
                *)in_stack_ffffffffffffff60._M_current);
    __last._M_current._M_current =
         std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::begin
                   ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)
                    in_stack_ffffffffffffff60._M_current);
    this_00 = std::
              make_move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck*,std::vector<CScriptCheck,std::allocator<CScriptCheck>>>>
                        (in_stack_ffffffffffffff60);
    __first = this_00;
    std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::end
              ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)
               in_stack_ffffffffffffff60._M_current);
    std::
    make_move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck*,std::vector<CScriptCheck,std::allocator<CScriptCheck>>>>
              (in_stack_ffffffffffffff60);
    std::vector<CScriptCheck,std::allocator<CScriptCheck>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck*,std::vector<CScriptCheck,std::allocator<CScriptCheck>>>>,void>
              ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)this_00._M_current._M_current,
               in_RSI,__first,__last);
    sVar3 = std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::size
                      ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)
                       in_stack_ffffffffffffff58);
    *(int *)(in_RDI + 0xac) = *(int *)(in_RDI + 0xac) + (int)sVar3;
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff58);
    sVar3 = std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::size
                      ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)
                       in_stack_ffffffffffffff58);
    if (sVar3 == 1) {
      std::condition_variable::notify_one();
    }
    else {
      std::condition_variable::notify_all();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        if (vChecks.empty()) {
            return;
        }

        {
            LOCK(m_mutex);
            queue.insert(queue.end(), std::make_move_iterator(vChecks.begin()), std::make_move_iterator(vChecks.end()));
            nTodo += vChecks.size();
        }

        if (vChecks.size() == 1) {
            m_worker_cv.notify_one();
        } else {
            m_worker_cv.notify_all();
        }
    }